

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::UnaryOperatorWrapper,duckdb::AbsOperator>
               (hugeint_t *ldata,hugeint_t *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  sel_t *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar2;
  uint64_t uVar3;
  int64_t iVar4;
  ValidityMask *pVVar5;
  char cVar6;
  ulong uVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  idx_t idx_in_entry;
  ulong uVar10;
  int64_t *piVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  hugeint_t zero;
  hugeint_t local_78;
  ValidityMask *local_60;
  ValidityMask *local_58;
  hugeint_t *local_50;
  buffer_ptr<ValidityBuffer> *local_48;
  hugeint_t local_40;
  
  local_60 = result_mask;
  local_50 = ldata;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      psVar1 = sel_vector->sel_vector;
      piVar11 = &result_data->upper;
      uVar10 = 0;
      do {
        uVar7 = uVar10;
        if (psVar1 != (sel_t *)0x0) {
          uVar7 = (ulong)psVar1[uVar10];
        }
        local_78.lower = local_50[uVar7].lower;
        local_78.upper = local_50[uVar7].upper;
        duckdb::hugeint_t::hugeint_t(&local_40,0);
        cVar6 = duckdb::hugeint_t::operator<(&local_78,&local_40);
        auVar13._8_8_ = local_78.upper;
        auVar13._0_8_ = local_78.lower;
        if (cVar6 != '\0') {
          auVar13 = duckdb::hugeint_t::operator-(&local_78);
        }
        ((hugeint_t *)(piVar11 + -1))->lower = auVar13._0_8_;
        *piVar11 = auVar13._8_8_;
        uVar10 = uVar10 + 1;
        piVar11 = piVar11 + 2;
      } while (count != uVar10);
    }
  }
  else if (count != 0) {
    psVar1 = sel_vector->sel_vector;
    local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
    piVar11 = &result_data->upper;
    uVar10 = 0;
    local_58 = mask;
    do {
      pVVar5 = local_60;
      uVar7 = uVar10;
      if (psVar1 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar1[uVar10];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[uVar7 >> 6] >>
           (uVar7 & 0x3f) & 1) == 0) {
        _Var9._M_head_impl = (local_60->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_40.lower = (local_60->super_TemplatedValidityMask<unsigned_long>).capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_40.lower);
          iVar4 = local_78.upper;
          uVar3 = local_78.lower;
          local_78.lower = 0;
          local_78.upper = 0;
          this = (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar3;
          (pVVar5->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar4;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78.upper);
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (local_48);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (local_60->super_TemplatedValidityMask<unsigned_long>).validity_mask = _Var9._M_head_impl;
          mask = local_58;
        }
        bVar2 = (byte)uVar10 & 0x3f;
        _Var9._M_head_impl[uVar10 >> 6] =
             _Var9._M_head_impl[uVar10 >> 6] & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
      }
      else {
        local_78.lower = local_50[uVar7].lower;
        local_78.upper = local_50[uVar7].upper;
        duckdb::hugeint_t::hugeint_t(&local_40,0);
        cVar6 = duckdb::hugeint_t::operator<(&local_78,&local_40);
        auVar12._8_8_ = local_78.upper;
        auVar12._0_8_ = local_78.lower;
        if (cVar6 != '\0') {
          auVar12 = duckdb::hugeint_t::operator-(&local_78);
        }
        ((hugeint_t *)(piVar11 + -1))->lower = auVar12._0_8_;
        *piVar11 = auVar12._8_8_;
        mask = local_58;
      }
      uVar10 = uVar10 + 1;
      piVar11 = piVar11 + 2;
    } while (count != uVar10);
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}